

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

void __thiscall Compiler::~Compiler(Compiler *this)

{
  Lexer *this_00;
  Parser *this_01;
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this_00 = this->lexer;
  if (this_00 != (Lexer *)0x0) {
    Lexer::~Lexer(this_00);
    operator_delete(this_00,0x60);
  }
  this_01 = this->parser;
  if (this_01 != (Parser *)0x0) {
    Syntax::Parser::~Parser(this_01);
    operator_delete(this_01,0x20);
  }
  if (this->symTabGenerator != (STGV *)0x0) {
    (*(this->symTabGenerator->super_Visitor)._vptr_Visitor[0x1d])();
  }
  if (this->typeChecker != (TCV *)0x0) {
    (*(this->typeChecker->super_Visitor)._vptr_Visitor[0x1d])();
  }
  pcVar1 = (this->filePath)._M_dataplus._M_p;
  paVar2 = &(this->filePath).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Compiler::~Compiler() {
    delete lexer;
    delete parser;
    delete symTabGenerator;
    delete typeChecker;
}